

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int reparse_predicate(ly_ctx *ctx,lyxp_expr *exp,uint16_t *exp_idx)

{
  int iVar1;
  int iVar2;
  
  iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_BRACK1,1);
  iVar2 = -1;
  if (iVar1 == 0) {
    *exp_idx = *exp_idx + 1;
    iVar1 = reparse_or_expr(ctx,exp,exp_idx);
    if (iVar1 == 0) {
      iVar1 = exp_check_token(ctx,exp,*exp_idx,LYXP_TOKEN_BRACK2,1);
      if (iVar1 == 0) {
        *exp_idx = *exp_idx + 1;
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
reparse_predicate(struct ly_ctx *ctx, struct lyxp_expr *exp, uint16_t *exp_idx)
{
    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_BRACK1, 1)) {
        return -1;
    }
    ++(*exp_idx);

    if (reparse_or_expr(ctx, exp, exp_idx)) {
        return -1;
    }

    if (exp_check_token(ctx, exp, *exp_idx, LYXP_TOKEN_BRACK2, 1)) {
        return -1;
    }
    ++(*exp_idx);

    return EXIT_SUCCESS;
}